

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseGenericRegion
          (FfsParser *this,UINT8 subtype,UByteArray *region,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index)

{
  TreeModel *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  UByteArray local_120;
  UByteArray local_100;
  CBString local_e0;
  UModelIndex local_c8;
  undefined1 local_b0 [8];
  CBString info;
  CBString local_88;
  CBString local_70;
  undefined1 local_58 [8];
  CBString name;
  UModelIndex *index_local;
  UModelIndex *parent_local;
  UINT32 localOffset_local;
  UByteArray *region_local;
  UINT8 subtype_local;
  FfsParser *this_local;
  
  name.super_tagbstring.data = (uchar *)index;
  bVar1 = UByteArray::isEmpty(region);
  if (bVar1) {
    this_local = (FfsParser *)0xc;
  }
  else {
    itemSubtypeToUString(&local_70,'?',subtype);
    Bstrlib::CBString::CBString(&local_88," region");
    Bstrlib::CBString::operator+((CBString *)local_58,&local_70,&local_88);
    Bstrlib::CBString::~CBString(&local_88);
    Bstrlib::CBString::~CBString(&local_70);
    uVar2 = UByteArray::size(region);
    uVar3 = UByteArray::size(region);
    usprintf((CBString *)local_b0,"Full size: %Xh (%u)",(ulong)uVar2,(ulong)uVar3);
    this_00 = this->model;
    Bstrlib::CBString::CBString(&local_e0);
    UByteArray::UByteArray(&local_100);
    UByteArray::UByteArray(&local_120);
    TreeModel::addItem(&local_c8,this_00,localOffset,'?',subtype,(CBString *)local_58,&local_e0,
                       (CBString *)local_b0,&local_100,region,&local_120,Fixed,parent,'\0');
    *(undefined8 *)name.super_tagbstring.data = local_c8._0_8_;
    *(uint64_t *)(name.super_tagbstring.data + 8) = local_c8.i;
    *(TreeModel **)(name.super_tagbstring.data + 0x10) = local_c8.m;
    UByteArray::~UByteArray(&local_120);
    UByteArray::~UByteArray(&local_100);
    Bstrlib::CBString::~CBString(&local_e0);
    this_local = (FfsParser *)0x0;
    Bstrlib::CBString::~CBString((CBString *)local_b0);
    Bstrlib::CBString::~CBString((CBString *)local_58);
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseGenericRegion(const UINT8 subtype, const UByteArray & region, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index)
{
    // Check sanity
    if (region.isEmpty())
        return U_EMPTY_REGION;
    
    // Get info
    UString name = itemSubtypeToUString(Types::Region, subtype) + UString(" region");
    UString info = usprintf("Full size: %Xh (%u)", (UINT32)region.size(), (UINT32)region.size());
    
    // Add tree item
    index = model->addItem(localOffset, Types::Region, subtype, name, UString(), info, UByteArray(), region, UByteArray(), Fixed, parent);
    
    return U_SUCCESS;
}